

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  int iVar3;
  undefined1 auVar4 [16];
  RTCFilterFunctionN p_Var5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  bool bVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  undefined1 auVar76 [16];
  long lVar77;
  uint uVar78;
  ulong uVar79;
  ulong uVar80;
  long lVar81;
  long lVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong *puVar86;
  ulong *puVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  undefined4 uVar93;
  ulong unaff_R15;
  size_t mask;
  bool bVar94;
  bool bVar95;
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar103 [32];
  float fVar111;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar116;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar117;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar118;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar123 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar137;
  float fVar138;
  undefined1 auVar139 [32];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar140 [64];
  float fVar148;
  float fVar149;
  undefined1 auVar150 [32];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar151 [64];
  float fVar164;
  float fVar165;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar168 [64];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  float fVar177;
  undefined1 auVar178 [32];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar179 [64];
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar189 [32];
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar190 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  float fVar212;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar213 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 local_18f0;
  undefined8 uStack_18e8;
  undefined1 local_18e0 [32];
  undefined1 local_18c0 [32];
  undefined1 local_18a0 [32];
  undefined1 local_1880 [32];
  undefined1 local_1860 [32];
  RayK<8> *local_1840;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  undefined1 local_1820 [32];
  undefined8 local_1800;
  float fStack_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  float fStack_17e8;
  float fStack_17e4;
  RTCFilterFunctionNArguments local_17d0;
  undefined1 local_17a0 [32];
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [32];
  undefined1 local_1720 [32];
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [8];
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  undefined4 uStack_1624;
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  float local_1360 [4];
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  undefined4 uStack_1344;
  undefined1 local_1340 [32];
  undefined4 local_1320;
  undefined4 uStack_131c;
  undefined4 uStack_1318;
  undefined4 uStack_1314;
  undefined4 uStack_1310;
  undefined4 uStack_130c;
  undefined4 uStack_1308;
  undefined4 uStack_1304;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [32];
  undefined4 local_1280;
  undefined4 uStack_127c;
  undefined4 uStack_1278;
  undefined4 uStack_1274;
  undefined4 uStack_1270;
  undefined4 uStack_126c;
  undefined4 uStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar93 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_16a0._4_4_ = uVar93;
  local_16a0._0_4_ = uVar93;
  local_16a0._8_4_ = uVar93;
  local_16a0._12_4_ = uVar93;
  local_16a0._16_4_ = uVar93;
  local_16a0._20_4_ = uVar93;
  local_16a0._24_4_ = uVar93;
  local_16a0._28_4_ = uVar93;
  auVar140 = ZEXT3264(local_16a0);
  uVar93 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_16c0._4_4_ = uVar93;
  local_16c0._0_4_ = uVar93;
  local_16c0._8_4_ = uVar93;
  local_16c0._12_4_ = uVar93;
  local_16c0._16_4_ = uVar93;
  local_16c0._20_4_ = uVar93;
  local_16c0._24_4_ = uVar93;
  local_16c0._28_4_ = uVar93;
  auVar151 = ZEXT3264(local_16c0);
  uVar93 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_16e0._4_4_ = uVar93;
  local_16e0._0_4_ = uVar93;
  local_16e0._8_4_ = uVar93;
  local_16e0._12_4_ = uVar93;
  local_16e0._16_4_ = uVar93;
  local_16e0._20_4_ = uVar93;
  local_16e0._24_4_ = uVar93;
  local_16e0._28_4_ = uVar93;
  auVar168 = ZEXT3264(local_16e0);
  fVar137 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar97 = ZEXT416((uint)(fVar137 * 0.99999964));
  auVar97 = vshufps_avx(auVar97,auVar97,0);
  local_1700._16_16_ = auVar97;
  local_1700._0_16_ = auVar97;
  auVar176 = ZEXT3264(local_1700);
  auVar97 = ZEXT416((uint)(fVar1 * 0.99999964));
  auVar97 = vshufps_avx(auVar97,auVar97,0);
  local_1720._16_16_ = auVar97;
  local_1720._0_16_ = auVar97;
  auVar179 = ZEXT3264(local_1720);
  auVar97 = ZEXT416((uint)(fVar2 * 0.99999964));
  auVar97 = vshufps_avx(auVar97,auVar97,0);
  local_1740._16_16_ = auVar97;
  local_1740._0_16_ = auVar97;
  auVar190 = ZEXT3264(local_1740);
  auVar97 = ZEXT416((uint)(fVar137 * 1.0000004));
  auVar97 = vshufps_avx(auVar97,auVar97,0);
  local_1760._16_16_ = auVar97;
  local_1760._0_16_ = auVar97;
  auVar209 = ZEXT3264(local_1760);
  auVar97 = ZEXT416((uint)(fVar1 * 1.0000004));
  auVar97 = vshufps_avx(auVar97,auVar97,0);
  local_1780._16_16_ = auVar97;
  local_1780._0_16_ = auVar97;
  auVar211 = ZEXT3264(local_1780);
  auVar97 = ZEXT416((uint)(fVar2 * 1.0000004));
  auVar97 = vshufps_avx(auVar97,auVar97,0);
  local_17a0._16_16_ = auVar97;
  local_17a0._0_16_ = auVar97;
  auVar213 = ZEXT3264(local_17a0);
  uVar88 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar85 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar91 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar79 = uVar88 ^ 0x20;
  uVar80 = uVar85 ^ 0x20;
  iVar3 = (tray->tnear).field_0.i[k];
  local_1660._4_4_ = iVar3;
  local_1660._0_4_ = iVar3;
  local_1660._8_4_ = iVar3;
  local_1660._12_4_ = iVar3;
  local_1660._16_4_ = iVar3;
  local_1660._20_4_ = iVar3;
  local_1660._24_4_ = iVar3;
  local_1660._28_4_ = iVar3;
  auVar123 = ZEXT3264(local_1660);
  iVar3 = (tray->tfar).field_0.i[k];
  local_1680._4_4_ = iVar3;
  local_1680._0_4_ = iVar3;
  local_1680._8_4_ = iVar3;
  local_1680._12_4_ = iVar3;
  local_1680._16_4_ = iVar3;
  local_1680._20_4_ = iVar3;
  local_1680._24_4_ = iVar3;
  local_1680._28_4_ = iVar3;
  auVar133 = ZEXT3264(local_1680);
  local_1620._16_16_ = mm_lookupmask_ps._240_16_;
  local_1620._0_16_ = mm_lookupmask_ps._0_16_;
  uVar78 = 1 << ((byte)k & 0x1f);
  uVar83 = (ulong)((uVar78 & 0xf) << 4);
  lVar81 = (long)((int)uVar78 >> 4) * 0x10;
  auVar112._8_4_ = 0x3f800000;
  auVar112._0_8_ = &DAT_3f8000003f800000;
  auVar112._12_4_ = 0x3f800000;
  auVar112._16_4_ = 0x3f800000;
  auVar112._20_4_ = 0x3f800000;
  auVar112._24_4_ = 0x3f800000;
  auVar112._28_4_ = 0x3f800000;
  auVar98._8_4_ = 0xbf800000;
  auVar98._0_8_ = 0xbf800000bf800000;
  auVar98._12_4_ = 0xbf800000;
  auVar98._16_4_ = 0xbf800000;
  auVar98._20_4_ = 0xbf800000;
  auVar98._24_4_ = 0xbf800000;
  auVar98._28_4_ = 0xbf800000;
  _local_1640 = vblendvps_avx(auVar112,auVar98,local_1620);
  local_1840 = ray;
  puVar87 = local_11f8;
  do {
    puVar86 = puVar87;
    if (puVar86 == &local_1200) break;
    puVar87 = puVar86 + -1;
    uVar90 = puVar86[-1];
    do {
      if ((uVar90 & 8) == 0) {
        auVar98 = vsubps_avx(*(undefined1 (*) [32])(uVar90 + 0x40 + uVar88),auVar140._0_32_);
        auVar27._4_4_ = auVar176._4_4_ * auVar98._4_4_;
        auVar27._0_4_ = auVar176._0_4_ * auVar98._0_4_;
        auVar27._8_4_ = auVar176._8_4_ * auVar98._8_4_;
        auVar27._12_4_ = auVar176._12_4_ * auVar98._12_4_;
        auVar27._16_4_ = auVar176._16_4_ * auVar98._16_4_;
        auVar27._20_4_ = auVar176._20_4_ * auVar98._20_4_;
        auVar27._24_4_ = auVar176._24_4_ * auVar98._24_4_;
        auVar27._28_4_ = auVar98._28_4_;
        auVar98 = vsubps_avx(*(undefined1 (*) [32])(uVar90 + 0x40 + uVar85),auVar151._0_32_);
        auVar28._4_4_ = auVar179._4_4_ * auVar98._4_4_;
        auVar28._0_4_ = auVar179._0_4_ * auVar98._0_4_;
        auVar28._8_4_ = auVar179._8_4_ * auVar98._8_4_;
        auVar28._12_4_ = auVar179._12_4_ * auVar98._12_4_;
        auVar28._16_4_ = auVar179._16_4_ * auVar98._16_4_;
        auVar28._20_4_ = auVar179._20_4_ * auVar98._20_4_;
        auVar28._24_4_ = auVar179._24_4_ * auVar98._24_4_;
        auVar28._28_4_ = auVar98._28_4_;
        auVar98 = vmaxps_avx(auVar27,auVar28);
        auVar112 = vsubps_avx(*(undefined1 (*) [32])(uVar90 + 0x40 + uVar91),auVar168._0_32_);
        auVar29._4_4_ = auVar190._4_4_ * auVar112._4_4_;
        auVar29._0_4_ = auVar190._0_4_ * auVar112._0_4_;
        auVar29._8_4_ = auVar190._8_4_ * auVar112._8_4_;
        auVar29._12_4_ = auVar190._12_4_ * auVar112._12_4_;
        auVar29._16_4_ = auVar190._16_4_ * auVar112._16_4_;
        auVar29._20_4_ = auVar190._20_4_ * auVar112._20_4_;
        auVar29._24_4_ = auVar190._24_4_ * auVar112._24_4_;
        auVar29._28_4_ = auVar112._28_4_;
        auVar112 = vmaxps_avx(auVar29,auVar123._0_32_);
        auVar98 = vmaxps_avx(auVar98,auVar112);
        auVar112 = vsubps_avx(*(undefined1 (*) [32])(uVar90 + 0x40 + uVar79),auVar140._0_32_);
        auVar30._4_4_ = auVar209._4_4_ * auVar112._4_4_;
        auVar30._0_4_ = auVar209._0_4_ * auVar112._0_4_;
        auVar30._8_4_ = auVar209._8_4_ * auVar112._8_4_;
        auVar30._12_4_ = auVar209._12_4_ * auVar112._12_4_;
        auVar30._16_4_ = auVar209._16_4_ * auVar112._16_4_;
        auVar30._20_4_ = auVar209._20_4_ * auVar112._20_4_;
        auVar30._24_4_ = auVar209._24_4_ * auVar112._24_4_;
        auVar30._28_4_ = auVar112._28_4_;
        auVar112 = vsubps_avx(*(undefined1 (*) [32])(uVar90 + 0x40 + uVar80),auVar151._0_32_);
        auVar31._4_4_ = auVar211._4_4_ * auVar112._4_4_;
        auVar31._0_4_ = auVar211._0_4_ * auVar112._0_4_;
        auVar31._8_4_ = auVar211._8_4_ * auVar112._8_4_;
        auVar31._12_4_ = auVar211._12_4_ * auVar112._12_4_;
        auVar31._16_4_ = auVar211._16_4_ * auVar112._16_4_;
        auVar31._20_4_ = auVar211._20_4_ * auVar112._20_4_;
        auVar31._24_4_ = auVar211._24_4_ * auVar112._24_4_;
        auVar31._28_4_ = auVar112._28_4_;
        auVar112 = vminps_avx(auVar30,auVar31);
        auVar27 = vsubps_avx(*(undefined1 (*) [32])(uVar90 + 0x40 + (uVar91 ^ 0x20)),auVar168._0_32_
                            );
        auVar32._4_4_ = auVar213._4_4_ * auVar27._4_4_;
        auVar32._0_4_ = auVar213._0_4_ * auVar27._0_4_;
        auVar32._8_4_ = auVar213._8_4_ * auVar27._8_4_;
        auVar32._12_4_ = auVar213._12_4_ * auVar27._12_4_;
        auVar32._16_4_ = auVar213._16_4_ * auVar27._16_4_;
        auVar32._20_4_ = auVar213._20_4_ * auVar27._20_4_;
        auVar32._24_4_ = auVar213._24_4_ * auVar27._24_4_;
        auVar32._28_4_ = auVar27._28_4_;
        auVar27 = vminps_avx(auVar32,auVar133._0_32_);
        auVar112 = vminps_avx(auVar112,auVar27);
        auVar98 = vcmpps_avx(auVar98,auVar112,2);
        uVar93 = vmovmskps_avx(auVar98);
        unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar93);
      }
      if ((uVar90 & 8) == 0) {
        if (unaff_R15 == 0) {
          uVar78 = 4;
        }
        else {
          uVar89 = uVar90 & 0xfffffffffffffff0;
          lVar82 = 0;
          if (unaff_R15 != 0) {
            for (; (unaff_R15 >> lVar82 & 1) == 0; lVar82 = lVar82 + 1) {
            }
          }
          uVar78 = 0;
          uVar90 = *(ulong *)(uVar89 + lVar82 * 8);
          uVar84 = unaff_R15 - 1 & unaff_R15;
          if (uVar84 != 0) {
            *puVar87 = uVar90;
            lVar82 = 0;
            if (uVar84 != 0) {
              for (; (uVar84 >> lVar82 & 1) == 0; lVar82 = lVar82 + 1) {
              }
            }
            uVar92 = uVar84 - 1;
            while( true ) {
              puVar87 = puVar87 + 1;
              uVar90 = *(ulong *)(uVar89 + lVar82 * 8);
              uVar92 = uVar92 & uVar84;
              if (uVar92 == 0) break;
              *puVar87 = uVar90;
              lVar82 = 0;
              if (uVar92 != 0) {
                for (; (uVar92 >> lVar82 & 1) == 0; lVar82 = lVar82 + 1) {
                }
              }
              uVar84 = uVar92 - 1;
            }
          }
        }
      }
      else {
        uVar78 = 6;
      }
    } while (uVar78 == 0);
    if (uVar78 == 6) {
      uVar89 = (ulong)((uint)uVar90 & 0xf) - 8;
      bVar94 = uVar89 != 0;
      if (bVar94) {
        uVar90 = uVar90 & 0xfffffffffffffff0;
        uVar84 = 0;
        do {
          lVar77 = uVar84 * 0xe0;
          lVar82 = uVar90 + 0xd0 + lVar77;
          local_1520 = *(undefined8 *)(lVar82 + 0x10);
          uStack_1518 = *(undefined8 *)(lVar82 + 0x18);
          lVar82 = uVar90 + 0xc0 + lVar77;
          local_1500 = *(undefined8 *)(lVar82 + 0x10);
          uStack_14f8 = *(undefined8 *)(lVar82 + 0x18);
          uStack_14f0 = local_1500;
          uStack_14e8 = uStack_14f8;
          uStack_1510 = local_1520;
          uStack_1508 = uStack_1518;
          auVar99._16_16_ = *(undefined1 (*) [16])(uVar90 + 0x60 + lVar77);
          auVar99._0_16_ = *(undefined1 (*) [16])(uVar90 + lVar77);
          auVar119._16_16_ = *(undefined1 (*) [16])(uVar90 + 0x70 + lVar77);
          auVar119._0_16_ = *(undefined1 (*) [16])(uVar90 + 0x10 + lVar77);
          auVar113._16_16_ = *(undefined1 (*) [16])(uVar90 + 0x80 + lVar77);
          auVar113._0_16_ = *(undefined1 (*) [16])(uVar90 + 0x20 + lVar77);
          auVar97 = *(undefined1 (*) [16])(uVar90 + 0x30 + lVar77);
          auVar134._16_16_ = auVar97;
          auVar134._0_16_ = auVar97;
          auVar97 = *(undefined1 (*) [16])(uVar90 + 0x40 + lVar77);
          auVar135._16_16_ = auVar97;
          auVar135._0_16_ = auVar97;
          auVar97 = *(undefined1 (*) [16])(uVar90 + 0x50 + lVar77);
          auVar139._16_16_ = auVar97;
          auVar139._0_16_ = auVar97;
          auVar97 = *(undefined1 (*) [16])(uVar90 + 0x90 + lVar77);
          auVar150._16_16_ = auVar97;
          auVar150._0_16_ = auVar97;
          auVar97 = *(undefined1 (*) [16])(uVar90 + 0xa0 + lVar77);
          auVar166._16_16_ = auVar97;
          auVar166._0_16_ = auVar97;
          auVar4 = *(undefined1 (*) [16])(uVar90 + 0xb0 + lVar77);
          auVar175._16_16_ = auVar4;
          auVar175._0_16_ = auVar4;
          uVar93 = *(undefined4 *)(local_1840 + k * 4);
          auVar178._4_4_ = uVar93;
          auVar178._0_4_ = uVar93;
          auVar178._8_4_ = uVar93;
          auVar178._12_4_ = uVar93;
          auVar178._16_4_ = uVar93;
          auVar178._20_4_ = uVar93;
          auVar178._24_4_ = uVar93;
          auVar178._28_4_ = uVar93;
          uVar93 = *(undefined4 *)(local_1840 + k * 4 + 0x20);
          auVar189._4_4_ = uVar93;
          auVar189._0_4_ = uVar93;
          auVar189._8_4_ = uVar93;
          auVar189._12_4_ = uVar93;
          auVar189._16_4_ = uVar93;
          auVar189._20_4_ = uVar93;
          auVar189._24_4_ = uVar93;
          auVar189._28_4_ = uVar93;
          uVar93 = *(undefined4 *)(local_1840 + k * 4 + 0x40);
          auVar210._4_4_ = uVar93;
          auVar210._0_4_ = uVar93;
          auVar210._8_4_ = uVar93;
          auVar210._12_4_ = uVar93;
          auVar210._16_4_ = uVar93;
          auVar210._20_4_ = uVar93;
          auVar210._24_4_ = uVar93;
          auVar210._28_4_ = uVar93;
          local_1860 = vsubps_avx(auVar99,auVar178);
          local_1880 = vsubps_avx(auVar119,auVar189);
          local_18a0 = vsubps_avx(auVar113,auVar210);
          auVar98 = vsubps_avx(auVar134,auVar178);
          auVar112 = vsubps_avx(auVar135,auVar189);
          auVar27 = vsubps_avx(auVar139,auVar210);
          auVar28 = vsubps_avx(auVar150,auVar178);
          auVar29 = vsubps_avx(auVar166,auVar189);
          auVar30 = vsubps_avx(auVar175,auVar210);
          local_18c0 = vsubps_avx(auVar28,local_1860);
          local_18e0 = vsubps_avx(auVar29,local_1880);
          local_1540 = vsubps_avx(auVar30,local_18a0);
          fVar1 = local_1880._0_4_;
          fVar137 = auVar29._0_4_ + fVar1;
          fVar8 = local_1880._4_4_;
          fVar141 = auVar29._4_4_ + fVar8;
          fVar106 = local_1880._8_4_;
          fVar143 = auVar29._8_4_ + fVar106;
          fVar109 = local_1880._12_4_;
          fVar144 = auVar29._12_4_ + fVar109;
          fVar11 = local_1880._16_4_;
          fVar145 = auVar29._16_4_ + fVar11;
          fVar14 = local_1880._20_4_;
          fVar146 = auVar29._20_4_ + fVar14;
          fVar17 = local_1880._24_4_;
          fVar147 = auVar29._24_4_ + fVar17;
          fVar2 = local_18a0._0_4_;
          fVar148 = auVar30._0_4_ + fVar2;
          fVar9 = local_18a0._4_4_;
          fVar152 = auVar30._4_4_ + fVar9;
          fVar107 = local_18a0._8_4_;
          fVar154 = auVar30._8_4_ + fVar107;
          fVar110 = local_18a0._12_4_;
          fVar156 = auVar30._12_4_ + fVar110;
          fVar12 = local_18a0._16_4_;
          fVar158 = auVar30._16_4_ + fVar12;
          fVar15 = local_18a0._20_4_;
          fVar160 = auVar30._20_4_ + fVar15;
          fVar18 = local_18a0._24_4_;
          fVar162 = auVar30._24_4_ + fVar18;
          fVar165 = local_18a0._28_4_;
          fVar20 = local_1540._0_4_;
          fVar21 = local_1540._4_4_;
          auVar33._4_4_ = fVar141 * fVar21;
          auVar33._0_4_ = fVar137 * fVar20;
          fVar22 = local_1540._8_4_;
          auVar33._8_4_ = fVar143 * fVar22;
          fVar23 = local_1540._12_4_;
          auVar33._12_4_ = fVar144 * fVar23;
          fVar24 = local_1540._16_4_;
          auVar33._16_4_ = fVar145 * fVar24;
          fVar25 = local_1540._20_4_;
          auVar33._20_4_ = fVar146 * fVar25;
          fVar96 = local_1540._24_4_;
          auVar33._24_4_ = fVar147 * fVar96;
          auVar33._28_4_ = auVar97._12_4_;
          fVar186 = local_18e0._0_4_;
          fVar191 = local_18e0._4_4_;
          auVar34._4_4_ = fVar191 * fVar152;
          auVar34._0_4_ = fVar186 * fVar148;
          fVar194 = local_18e0._8_4_;
          auVar34._8_4_ = fVar194 * fVar154;
          fVar197 = local_18e0._12_4_;
          auVar34._12_4_ = fVar197 * fVar156;
          fVar200 = local_18e0._16_4_;
          auVar34._16_4_ = fVar200 * fVar158;
          fVar203 = local_18e0._20_4_;
          auVar34._20_4_ = fVar203 * fVar160;
          fVar206 = local_18e0._24_4_;
          auVar34._24_4_ = fVar206 * fVar162;
          auVar34._28_4_ = auVar4._12_4_;
          auVar31 = vsubps_avx(auVar34,auVar33);
          fVar7 = local_1860._0_4_;
          fVar164 = auVar28._0_4_ + fVar7;
          fVar10 = local_1860._4_4_;
          fVar169 = auVar28._4_4_ + fVar10;
          fVar108 = local_1860._8_4_;
          fVar170 = auVar28._8_4_ + fVar108;
          fVar111 = local_1860._12_4_;
          fVar171 = auVar28._12_4_ + fVar111;
          fVar13 = local_1860._16_4_;
          fVar172 = auVar28._16_4_ + fVar13;
          fVar16 = local_1860._20_4_;
          fVar173 = auVar28._20_4_ + fVar16;
          fVar19 = local_1860._24_4_;
          fVar174 = auVar28._24_4_ + fVar19;
          fVar177 = local_18c0._0_4_;
          fVar180 = local_18c0._4_4_;
          auVar35._4_4_ = fVar180 * fVar152;
          auVar35._0_4_ = fVar177 * fVar148;
          fVar181 = local_18c0._8_4_;
          auVar35._8_4_ = fVar181 * fVar154;
          fVar182 = local_18c0._12_4_;
          auVar35._12_4_ = fVar182 * fVar156;
          fVar183 = local_18c0._16_4_;
          auVar35._16_4_ = fVar183 * fVar158;
          fVar184 = local_18c0._20_4_;
          auVar35._20_4_ = fVar184 * fVar160;
          fVar185 = local_18c0._24_4_;
          auVar35._24_4_ = fVar185 * fVar162;
          auVar35._28_4_ = auVar30._28_4_ + fVar165;
          auVar36._4_4_ = fVar169 * fVar21;
          auVar36._0_4_ = fVar164 * fVar20;
          auVar36._8_4_ = fVar170 * fVar22;
          auVar36._12_4_ = fVar171 * fVar23;
          auVar36._16_4_ = fVar172 * fVar24;
          auVar36._20_4_ = fVar173 * fVar25;
          auVar36._24_4_ = fVar174 * fVar96;
          auVar36._28_4_ = auVar4._12_4_;
          auVar32 = vsubps_avx(auVar36,auVar35);
          auVar37._4_4_ = fVar169 * fVar191;
          auVar37._0_4_ = fVar164 * fVar186;
          auVar37._8_4_ = fVar170 * fVar194;
          auVar37._12_4_ = fVar171 * fVar197;
          auVar37._16_4_ = fVar172 * fVar200;
          auVar37._20_4_ = fVar173 * fVar203;
          auVar37._24_4_ = fVar174 * fVar206;
          auVar37._28_4_ = auVar28._28_4_ + local_1860._28_4_;
          auVar38._4_4_ = fVar180 * fVar141;
          auVar38._0_4_ = fVar177 * fVar137;
          auVar38._8_4_ = fVar181 * fVar143;
          auVar38._12_4_ = fVar182 * fVar144;
          auVar38._16_4_ = fVar183 * fVar145;
          auVar38._20_4_ = fVar184 * fVar146;
          auVar38._24_4_ = fVar185 * fVar147;
          auVar38._28_4_ = auVar29._28_4_ + local_1880._28_4_;
          auVar33 = vsubps_avx(auVar38,auVar37);
          local_1800._4_4_ = *(float *)(local_1840 + k * 4 + 0xa0);
          fVar137 = *(float *)(local_1840 + k * 4 + 0xc0);
          local_1820._4_4_ = fVar137;
          local_1820._0_4_ = fVar137;
          local_1820._8_4_ = fVar137;
          local_1820._12_4_ = fVar137;
          local_1820._16_4_ = fVar137;
          local_1820._20_4_ = fVar137;
          local_1820._24_4_ = fVar137;
          local_1820._28_4_ = fVar137;
          fStack_1838 = *(float *)(local_1840 + k * 4 + 0x80);
          local_15a0._0_4_ =
               auVar31._0_4_ * fStack_1838 +
               local_1800._4_4_ * auVar32._0_4_ + auVar33._0_4_ * fVar137;
          local_15a0._4_4_ =
               auVar31._4_4_ * fStack_1838 +
               local_1800._4_4_ * auVar32._4_4_ + auVar33._4_4_ * fVar137;
          local_15a0._8_4_ =
               auVar31._8_4_ * fStack_1838 +
               local_1800._4_4_ * auVar32._8_4_ + auVar33._8_4_ * fVar137;
          local_15a0._12_4_ =
               auVar31._12_4_ * fStack_1838 +
               local_1800._4_4_ * auVar32._12_4_ + auVar33._12_4_ * fVar137;
          local_15a0._16_4_ =
               auVar31._16_4_ * fStack_1838 +
               local_1800._4_4_ * auVar32._16_4_ + auVar33._16_4_ * fVar137;
          local_15a0._20_4_ =
               auVar31._20_4_ * fStack_1838 +
               local_1800._4_4_ * auVar32._20_4_ + auVar33._20_4_ * fVar137;
          local_15a0._24_4_ =
               auVar31._24_4_ * fStack_1838 +
               local_1800._4_4_ * auVar32._24_4_ + auVar33._24_4_ * fVar137;
          local_15a0._28_4_ = auVar32._28_4_ + auVar32._28_4_ + auVar33._28_4_;
          local_1560 = vsubps_avx(local_1880,auVar112);
          local_1580 = vsubps_avx(local_18a0,auVar27);
          fVar154 = fVar1 + auVar112._0_4_;
          fVar156 = fVar8 + auVar112._4_4_;
          fVar158 = fVar106 + auVar112._8_4_;
          fVar160 = fVar109 + auVar112._12_4_;
          fVar162 = fVar11 + auVar112._16_4_;
          fVar164 = fVar14 + auVar112._20_4_;
          fVar169 = fVar17 + auVar112._24_4_;
          fVar141 = auVar112._28_4_;
          fVar143 = auVar27._0_4_ + fVar2;
          fVar144 = auVar27._4_4_ + fVar9;
          fVar145 = auVar27._8_4_ + fVar107;
          fVar146 = auVar27._12_4_ + fVar110;
          fVar147 = auVar27._16_4_ + fVar12;
          fVar148 = auVar27._20_4_ + fVar15;
          fVar152 = auVar27._24_4_ + fVar18;
          fVar187 = local_1580._0_4_;
          fVar192 = local_1580._4_4_;
          auVar39._4_4_ = fVar192 * fVar156;
          auVar39._0_4_ = fVar187 * fVar154;
          fVar195 = local_1580._8_4_;
          auVar39._8_4_ = fVar195 * fVar158;
          fVar198 = local_1580._12_4_;
          auVar39._12_4_ = fVar198 * fVar160;
          fVar201 = local_1580._16_4_;
          auVar39._16_4_ = fVar201 * fVar162;
          fVar204 = local_1580._20_4_;
          auVar39._20_4_ = fVar204 * fVar164;
          fVar207 = local_1580._24_4_;
          auVar39._24_4_ = fVar207 * fVar169;
          auVar39._28_4_ = auVar31._28_4_;
          fVar149 = local_1560._0_4_;
          fVar153 = local_1560._4_4_;
          auVar40._4_4_ = fVar153 * fVar144;
          auVar40._0_4_ = fVar149 * fVar143;
          fVar155 = local_1560._8_4_;
          auVar40._8_4_ = fVar155 * fVar145;
          fVar157 = local_1560._12_4_;
          auVar40._12_4_ = fVar157 * fVar146;
          fVar159 = local_1560._16_4_;
          auVar40._16_4_ = fVar159 * fVar147;
          fVar161 = local_1560._20_4_;
          auVar40._20_4_ = fVar161 * fVar148;
          fVar163 = local_1560._24_4_;
          auVar40._24_4_ = fVar163 * fVar152;
          auVar40._28_4_ = fVar165;
          auVar31 = vsubps_avx(auVar40,auVar39);
          auVar32 = vsubps_avx(local_1860,auVar98);
          fVar212 = auVar32._0_4_;
          fVar214 = auVar32._4_4_;
          auVar41._4_4_ = fVar214 * fVar144;
          auVar41._0_4_ = fVar212 * fVar143;
          fVar215 = auVar32._8_4_;
          auVar41._8_4_ = fVar215 * fVar145;
          fVar216 = auVar32._12_4_;
          auVar41._12_4_ = fVar216 * fVar146;
          fVar217 = auVar32._16_4_;
          auVar41._16_4_ = fVar217 * fVar147;
          fVar218 = auVar32._20_4_;
          auVar41._20_4_ = fVar218 * fVar148;
          fVar219 = auVar32._24_4_;
          auVar41._24_4_ = fVar219 * fVar152;
          auVar41._28_4_ = auVar27._28_4_ + fVar165;
          fVar165 = fVar7 + auVar98._0_4_;
          fVar143 = fVar10 + auVar98._4_4_;
          fVar144 = fVar108 + auVar98._8_4_;
          fVar145 = fVar111 + auVar98._12_4_;
          fVar146 = fVar13 + auVar98._16_4_;
          fVar147 = fVar16 + auVar98._20_4_;
          fVar148 = fVar19 + auVar98._24_4_;
          auVar42._4_4_ = fVar143 * fVar192;
          auVar42._0_4_ = fVar165 * fVar187;
          auVar42._8_4_ = fVar144 * fVar195;
          auVar42._12_4_ = fVar145 * fVar198;
          auVar42._16_4_ = fVar146 * fVar201;
          auVar42._20_4_ = fVar147 * fVar204;
          auVar42._24_4_ = fVar148 * fVar207;
          auVar42._28_4_ = local_1580._28_4_;
          auVar32 = vsubps_avx(auVar42,auVar41);
          auVar43._4_4_ = fVar143 * fVar153;
          auVar43._0_4_ = fVar165 * fVar149;
          auVar43._8_4_ = fVar144 * fVar155;
          auVar43._12_4_ = fVar145 * fVar157;
          auVar43._16_4_ = fVar146 * fVar159;
          auVar43._20_4_ = fVar147 * fVar161;
          auVar43._24_4_ = fVar148 * fVar163;
          auVar43._28_4_ = local_1860._28_4_ + auVar98._28_4_;
          auVar44._4_4_ = fVar214 * fVar156;
          auVar44._0_4_ = fVar212 * fVar154;
          auVar44._8_4_ = fVar215 * fVar158;
          auVar44._12_4_ = fVar216 * fVar160;
          auVar44._16_4_ = fVar217 * fVar162;
          auVar44._20_4_ = fVar218 * fVar164;
          auVar44._24_4_ = fVar219 * fVar169;
          auVar44._28_4_ = local_1880._28_4_ + fVar141;
          auVar33 = vsubps_avx(auVar44,auVar43);
          local_15c0._0_4_ =
               fStack_1838 * auVar31._0_4_ +
               auVar33._0_4_ * fVar137 + local_1800._4_4_ * auVar32._0_4_;
          local_15c0._4_4_ =
               fStack_1838 * auVar31._4_4_ +
               auVar33._4_4_ * fVar137 + local_1800._4_4_ * auVar32._4_4_;
          local_15c0._8_4_ =
               fStack_1838 * auVar31._8_4_ +
               auVar33._8_4_ * fVar137 + local_1800._4_4_ * auVar32._8_4_;
          local_15c0._12_4_ =
               fStack_1838 * auVar31._12_4_ +
               auVar33._12_4_ * fVar137 + local_1800._4_4_ * auVar32._12_4_;
          local_15c0._16_4_ =
               fStack_1838 * auVar31._16_4_ +
               auVar33._16_4_ * fVar137 + local_1800._4_4_ * auVar32._16_4_;
          local_15c0._20_4_ =
               fStack_1838 * auVar31._20_4_ +
               auVar33._20_4_ * fVar137 + local_1800._4_4_ * auVar32._20_4_;
          local_15c0._24_4_ =
               fStack_1838 * auVar31._24_4_ +
               auVar33._24_4_ * fVar137 + local_1800._4_4_ * auVar32._24_4_;
          local_15c0._28_4_ = auVar31._28_4_ + auVar33._28_4_ + auVar32._28_4_;
          auVar32 = vsubps_avx(auVar98,auVar28);
          fVar169 = auVar98._0_4_ + auVar28._0_4_;
          fVar170 = auVar98._4_4_ + auVar28._4_4_;
          fVar171 = auVar98._8_4_ + auVar28._8_4_;
          fVar172 = auVar98._12_4_ + auVar28._12_4_;
          fVar173 = auVar98._16_4_ + auVar28._16_4_;
          fVar174 = auVar98._20_4_ + auVar28._20_4_;
          fVar116 = auVar98._24_4_ + auVar28._24_4_;
          fVar117 = auVar98._28_4_ + auVar28._28_4_;
          auVar28 = vsubps_avx(auVar112,auVar29);
          fVar152 = auVar112._0_4_ + auVar29._0_4_;
          fVar154 = auVar112._4_4_ + auVar29._4_4_;
          fVar156 = auVar112._8_4_ + auVar29._8_4_;
          fVar158 = auVar112._12_4_ + auVar29._12_4_;
          fVar160 = auVar112._16_4_ + auVar29._16_4_;
          fVar162 = auVar112._20_4_ + auVar29._20_4_;
          fVar164 = auVar112._24_4_ + auVar29._24_4_;
          auVar98 = vsubps_avx(auVar27,auVar30);
          fVar118 = auVar27._0_4_ + auVar30._0_4_;
          fVar124 = auVar27._4_4_ + auVar30._4_4_;
          fVar125 = auVar27._8_4_ + auVar30._8_4_;
          fVar126 = auVar27._12_4_ + auVar30._12_4_;
          fVar127 = auVar27._16_4_ + auVar30._16_4_;
          fVar128 = auVar27._20_4_ + auVar30._20_4_;
          fVar129 = auVar27._24_4_ + auVar30._24_4_;
          fVar188 = auVar98._0_4_;
          fVar193 = auVar98._4_4_;
          auVar45._4_4_ = fVar193 * fVar154;
          auVar45._0_4_ = fVar188 * fVar152;
          fVar196 = auVar98._8_4_;
          auVar45._8_4_ = fVar196 * fVar156;
          fVar199 = auVar98._12_4_;
          auVar45._12_4_ = fVar199 * fVar158;
          fVar202 = auVar98._16_4_;
          auVar45._16_4_ = fVar202 * fVar160;
          fVar205 = auVar98._20_4_;
          auVar45._20_4_ = fVar205 * fVar162;
          fVar208 = auVar98._24_4_;
          auVar45._24_4_ = fVar208 * fVar164;
          auVar45._28_4_ = auVar31._28_4_;
          fVar165 = auVar28._0_4_;
          fVar143 = auVar28._4_4_;
          auVar46._4_4_ = fVar143 * fVar124;
          auVar46._0_4_ = fVar165 * fVar118;
          fVar144 = auVar28._8_4_;
          auVar46._8_4_ = fVar144 * fVar125;
          fVar145 = auVar28._12_4_;
          auVar46._12_4_ = fVar145 * fVar126;
          fVar146 = auVar28._16_4_;
          auVar46._16_4_ = fVar146 * fVar127;
          fVar147 = auVar28._20_4_;
          auVar46._20_4_ = fVar147 * fVar128;
          fVar148 = auVar28._24_4_;
          auVar46._24_4_ = fVar148 * fVar129;
          auVar46._28_4_ = fVar141;
          auVar98 = vsubps_avx(auVar46,auVar45);
          fVar138 = auVar32._0_4_;
          fVar142 = auVar32._4_4_;
          auVar47._4_4_ = fVar142 * fVar124;
          auVar47._0_4_ = fVar138 * fVar118;
          fVar118 = auVar32._8_4_;
          auVar47._8_4_ = fVar118 * fVar125;
          fVar124 = auVar32._12_4_;
          auVar47._12_4_ = fVar124 * fVar126;
          fVar125 = auVar32._16_4_;
          auVar47._16_4_ = fVar125 * fVar127;
          fVar126 = auVar32._20_4_;
          auVar47._20_4_ = fVar126 * fVar128;
          fVar127 = auVar32._24_4_;
          auVar47._24_4_ = fVar127 * fVar129;
          auVar47._28_4_ = auVar27._28_4_ + auVar30._28_4_;
          auVar48._4_4_ = fVar193 * fVar170;
          auVar48._0_4_ = fVar188 * fVar169;
          auVar48._8_4_ = fVar196 * fVar171;
          auVar48._12_4_ = fVar199 * fVar172;
          auVar48._16_4_ = fVar202 * fVar173;
          auVar48._20_4_ = fVar205 * fVar174;
          auVar48._24_4_ = fVar208 * fVar116;
          auVar48._28_4_ = fVar141;
          auVar112 = vsubps_avx(auVar48,auVar47);
          auVar49._4_4_ = fVar170 * fVar143;
          auVar49._0_4_ = fVar169 * fVar165;
          auVar49._8_4_ = fVar171 * fVar144;
          auVar49._12_4_ = fVar172 * fVar145;
          auVar49._16_4_ = fVar173 * fVar146;
          auVar49._20_4_ = fVar174 * fVar147;
          auVar49._24_4_ = fVar116 * fVar148;
          auVar49._28_4_ = fVar117;
          auVar50._4_4_ = fVar142 * fVar154;
          auVar50._0_4_ = fVar138 * fVar152;
          auVar50._8_4_ = fVar118 * fVar156;
          auVar50._12_4_ = fVar124 * fVar158;
          auVar50._16_4_ = fVar125 * fVar160;
          auVar50._20_4_ = fVar126 * fVar162;
          auVar50._24_4_ = fVar127 * fVar164;
          auVar50._28_4_ = fVar141 + auVar29._28_4_;
          auVar27 = vsubps_avx(auVar50,auVar49);
          local_1800._0_4_ = local_1800._4_4_;
          fStack_17f8 = local_1800._4_4_;
          fStack_17f4 = local_1800._4_4_;
          fStack_17f0 = local_1800._4_4_;
          fStack_17ec = local_1800._4_4_;
          fStack_17e8 = local_1800._4_4_;
          fStack_17e4 = local_1800._4_4_;
          auVar103._0_4_ =
               fStack_1838 * auVar98._0_4_ +
               auVar27._0_4_ * fVar137 + local_1800._4_4_ * auVar112._0_4_;
          auVar103._4_4_ =
               fStack_1838 * auVar98._4_4_ +
               auVar27._4_4_ * fVar137 + local_1800._4_4_ * auVar112._4_4_;
          auVar103._8_4_ =
               fStack_1838 * auVar98._8_4_ +
               auVar27._8_4_ * fVar137 + local_1800._4_4_ * auVar112._8_4_;
          auVar103._12_4_ =
               fStack_1838 * auVar98._12_4_ +
               auVar27._12_4_ * fVar137 + local_1800._4_4_ * auVar112._12_4_;
          auVar103._16_4_ =
               fStack_1838 * auVar98._16_4_ +
               auVar27._16_4_ * fVar137 + local_1800._4_4_ * auVar112._16_4_;
          auVar103._20_4_ =
               fStack_1838 * auVar98._20_4_ +
               auVar27._20_4_ * fVar137 + local_1800._4_4_ * auVar112._20_4_;
          auVar103._24_4_ =
               fStack_1838 * auVar98._24_4_ +
               auVar27._24_4_ * fVar137 + local_1800._4_4_ * auVar112._24_4_;
          auVar103._28_4_ = fVar117 + auVar27._28_4_ + fVar117;
          local_15e0._0_4_ = auVar103._0_4_ + local_15a0._0_4_ + local_15c0._0_4_;
          local_15e0._4_4_ = auVar103._4_4_ + local_15a0._4_4_ + local_15c0._4_4_;
          local_15e0._8_4_ = auVar103._8_4_ + local_15a0._8_4_ + local_15c0._8_4_;
          local_15e0._12_4_ = auVar103._12_4_ + local_15a0._12_4_ + local_15c0._12_4_;
          local_15e0._16_4_ = auVar103._16_4_ + local_15a0._16_4_ + local_15c0._16_4_;
          local_15e0._20_4_ = auVar103._20_4_ + local_15a0._20_4_ + local_15c0._20_4_;
          local_15e0._24_4_ = auVar103._24_4_ + local_15a0._24_4_ + local_15c0._24_4_;
          local_15e0._28_4_ = auVar103._28_4_ + local_15a0._28_4_ + local_15c0._28_4_;
          auVar98 = vminps_avx(local_15a0,local_15c0);
          auVar98 = vminps_avx(auVar98,auVar103);
          auVar120._8_4_ = 0x7fffffff;
          auVar120._0_8_ = 0x7fffffff7fffffff;
          auVar120._12_4_ = 0x7fffffff;
          auVar120._16_4_ = 0x7fffffff;
          auVar120._20_4_ = 0x7fffffff;
          auVar120._24_4_ = 0x7fffffff;
          auVar120._28_4_ = 0x7fffffff;
          local_1600 = vandps_avx(local_15e0,auVar120);
          fVar152 = local_1600._0_4_ * 1.1920929e-07;
          fVar154 = local_1600._4_4_ * 1.1920929e-07;
          auVar51._4_4_ = fVar154;
          auVar51._0_4_ = fVar152;
          fVar156 = local_1600._8_4_ * 1.1920929e-07;
          auVar51._8_4_ = fVar156;
          fVar158 = local_1600._12_4_ * 1.1920929e-07;
          auVar51._12_4_ = fVar158;
          fVar160 = local_1600._16_4_ * 1.1920929e-07;
          auVar51._16_4_ = fVar160;
          fVar162 = local_1600._20_4_ * 1.1920929e-07;
          auVar51._20_4_ = fVar162;
          fVar164 = local_1600._24_4_ * 1.1920929e-07;
          auVar51._24_4_ = fVar164;
          auVar51._28_4_ = 0x34000000;
          auVar130._0_8_ = CONCAT44(fVar154,fVar152) ^ 0x8000000080000000;
          auVar130._8_4_ = -fVar156;
          auVar130._12_4_ = -fVar158;
          auVar130._16_4_ = -fVar160;
          auVar130._20_4_ = -fVar162;
          auVar130._24_4_ = -fVar164;
          auVar130._28_4_ = 0xb4000000;
          auVar98 = vcmpps_avx(auVar98,auVar130,5);
          auVar27 = vmaxps_avx(local_15a0,local_15c0);
          auVar112 = vmaxps_avx(auVar27,auVar103);
          auVar112 = vcmpps_avx(auVar112,auVar51,2);
          auVar112 = vorps_avx(auVar98,auVar112);
          if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar112 >> 0x7f,0) == '\0') &&
                (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar112 >> 0xbf,0) == '\0') &&
              (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar112[0x1f]) {
LAB_004cb5f9:
            auVar140 = ZEXT3264(local_16a0);
            auVar151 = ZEXT3264(local_16c0);
            auVar168 = ZEXT3264(local_16e0);
            auVar176 = ZEXT3264(local_1700);
            auVar179 = ZEXT3264(local_1720);
            auVar190 = ZEXT3264(local_1740);
            auVar209 = ZEXT3264(local_1760);
            auVar211 = ZEXT3264(local_1780);
            auVar213 = ZEXT3264(local_17a0);
            auVar123 = ZEXT3264(local_1660);
            auVar133 = ZEXT3264(local_1680);
          }
          else {
            auVar52._4_4_ = fVar153 * fVar21;
            auVar52._0_4_ = fVar149 * fVar20;
            auVar52._8_4_ = fVar155 * fVar22;
            auVar52._12_4_ = fVar157 * fVar23;
            auVar52._16_4_ = fVar159 * fVar24;
            auVar52._20_4_ = fVar161 * fVar25;
            auVar52._24_4_ = fVar163 * fVar96;
            auVar52._28_4_ = auVar98._28_4_;
            auVar53._4_4_ = fVar191 * fVar192;
            auVar53._0_4_ = fVar186 * fVar187;
            auVar53._8_4_ = fVar194 * fVar195;
            auVar53._12_4_ = fVar197 * fVar198;
            auVar53._16_4_ = fVar200 * fVar201;
            auVar53._20_4_ = fVar203 * fVar204;
            auVar53._24_4_ = fVar206 * fVar207;
            auVar53._28_4_ = 0x34000000;
            auVar29 = vsubps_avx(auVar53,auVar52);
            auVar54._4_4_ = fVar192 * fVar143;
            auVar54._0_4_ = fVar187 * fVar165;
            auVar54._8_4_ = fVar195 * fVar144;
            auVar54._12_4_ = fVar198 * fVar145;
            auVar54._16_4_ = fVar201 * fVar146;
            auVar54._20_4_ = fVar204 * fVar147;
            auVar54._24_4_ = fVar207 * fVar148;
            auVar54._28_4_ = auVar27._28_4_;
            auVar55._4_4_ = fVar153 * fVar193;
            auVar55._0_4_ = fVar149 * fVar188;
            auVar55._8_4_ = fVar155 * fVar196;
            auVar55._12_4_ = fVar157 * fVar199;
            auVar55._16_4_ = fVar159 * fVar202;
            auVar55._20_4_ = fVar161 * fVar205;
            auVar55._24_4_ = fVar163 * fVar208;
            auVar55._28_4_ = fVar141;
            auVar30 = vsubps_avx(auVar55,auVar54);
            auVar167._8_4_ = 0x7fffffff;
            auVar167._0_8_ = 0x7fffffff7fffffff;
            auVar167._12_4_ = 0x7fffffff;
            auVar167._16_4_ = 0x7fffffff;
            auVar167._20_4_ = 0x7fffffff;
            auVar167._24_4_ = 0x7fffffff;
            auVar167._28_4_ = 0x7fffffff;
            auVar98 = vandps_avx(auVar167,auVar52);
            auVar27 = vandps_avx(auVar167,auVar54);
            auVar98 = vcmpps_avx(auVar98,auVar27,1);
            local_1480 = vblendvps_avx(auVar30,auVar29,auVar98);
            auVar56._4_4_ = fVar214 * fVar193;
            auVar56._0_4_ = fVar212 * fVar188;
            auVar56._8_4_ = fVar215 * fVar196;
            auVar56._12_4_ = fVar216 * fVar199;
            auVar56._16_4_ = fVar217 * fVar202;
            auVar56._20_4_ = fVar218 * fVar205;
            auVar56._24_4_ = fVar219 * fVar208;
            auVar56._28_4_ = auVar98._28_4_;
            auVar57._4_4_ = fVar214 * fVar21;
            auVar57._0_4_ = fVar212 * fVar20;
            auVar57._8_4_ = fVar215 * fVar22;
            auVar57._12_4_ = fVar216 * fVar23;
            auVar57._16_4_ = fVar217 * fVar24;
            auVar57._20_4_ = fVar218 * fVar25;
            auVar57._24_4_ = fVar219 * fVar96;
            auVar57._28_4_ = auVar29._28_4_;
            auVar58._4_4_ = fVar192 * fVar180;
            auVar58._0_4_ = fVar187 * fVar177;
            auVar58._8_4_ = fVar195 * fVar181;
            auVar58._12_4_ = fVar198 * fVar182;
            auVar58._16_4_ = fVar201 * fVar183;
            auVar58._20_4_ = fVar204 * fVar184;
            auVar58._24_4_ = fVar207 * fVar185;
            auVar58._28_4_ = auVar27._28_4_;
            auVar29 = vsubps_avx(auVar57,auVar58);
            auVar59._4_4_ = fVar192 * fVar142;
            auVar59._0_4_ = fVar187 * fVar138;
            auVar59._8_4_ = fVar195 * fVar118;
            auVar59._12_4_ = fVar198 * fVar124;
            auVar59._16_4_ = fVar201 * fVar125;
            auVar59._20_4_ = fVar204 * fVar126;
            auVar59._24_4_ = fVar207 * fVar127;
            auVar59._28_4_ = local_1540._28_4_;
            auVar30 = vsubps_avx(auVar59,auVar56);
            auVar98 = vandps_avx(auVar167,auVar58);
            auVar27 = vandps_avx(auVar167,auVar56);
            auVar27 = vcmpps_avx(auVar98,auVar27,1);
            local_1460 = vblendvps_avx(auVar30,auVar29,auVar27);
            auVar60._4_4_ = fVar153 * fVar142;
            auVar60._0_4_ = fVar149 * fVar138;
            auVar60._8_4_ = fVar155 * fVar118;
            auVar60._12_4_ = fVar157 * fVar124;
            auVar60._16_4_ = fVar159 * fVar125;
            auVar60._20_4_ = fVar161 * fVar126;
            auVar60._24_4_ = fVar163 * fVar127;
            auVar60._28_4_ = auVar27._28_4_;
            auVar61._4_4_ = fVar153 * fVar180;
            auVar61._0_4_ = fVar149 * fVar177;
            auVar61._8_4_ = fVar155 * fVar181;
            auVar61._12_4_ = fVar157 * fVar182;
            auVar61._16_4_ = fVar159 * fVar183;
            auVar61._20_4_ = fVar161 * fVar184;
            auVar61._24_4_ = fVar163 * fVar185;
            auVar61._28_4_ = auVar29._28_4_;
            auVar62._4_4_ = fVar214 * fVar191;
            auVar62._0_4_ = fVar212 * fVar186;
            auVar62._8_4_ = fVar215 * fVar194;
            auVar62._12_4_ = fVar216 * fVar197;
            auVar62._16_4_ = fVar217 * fVar200;
            auVar62._20_4_ = fVar218 * fVar203;
            auVar62._24_4_ = fVar219 * fVar206;
            auVar62._28_4_ = auVar98._28_4_;
            auVar63._4_4_ = fVar214 * fVar143;
            auVar63._0_4_ = fVar212 * fVar165;
            auVar63._8_4_ = fVar215 * fVar144;
            auVar63._12_4_ = fVar216 * fVar145;
            auVar63._16_4_ = fVar217 * fVar146;
            auVar63._20_4_ = fVar218 * fVar147;
            auVar63._24_4_ = fVar219 * fVar148;
            auVar63._28_4_ = auVar28._28_4_;
            auVar28 = vsubps_avx(auVar61,auVar62);
            auVar29 = vsubps_avx(auVar63,auVar60);
            auVar98 = vandps_avx(auVar167,auVar62);
            auVar27 = vandps_avx(auVar167,auVar60);
            auVar27 = vcmpps_avx(auVar98,auVar27,1);
            local_1440 = vblendvps_avx(auVar29,auVar28,auVar27);
            auVar97 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
            fVar152 = local_1440._0_4_;
            fVar154 = local_1440._4_4_;
            fVar156 = local_1440._8_4_;
            fVar158 = local_1440._12_4_;
            fVar160 = local_1440._16_4_;
            fVar162 = local_1440._20_4_;
            fVar164 = local_1440._24_4_;
            fVar169 = local_1460._0_4_;
            fVar170 = local_1460._4_4_;
            fVar171 = local_1460._8_4_;
            fVar172 = local_1460._12_4_;
            fVar173 = local_1460._16_4_;
            fVar174 = local_1460._20_4_;
            fVar25 = auVar112._28_4_;
            fVar116 = local_1460._24_4_;
            fVar165 = local_1480._0_4_;
            fVar141 = local_1480._4_4_;
            fVar20 = local_1480._8_4_;
            fVar21 = local_1480._12_4_;
            fVar22 = local_1480._16_4_;
            fVar23 = local_1480._20_4_;
            fVar24 = local_1480._24_4_;
            fVar96 = fStack_1838 * fVar165 + fVar152 * fVar137 + fVar169 * local_1800._4_4_;
            fVar143 = fStack_1838 * fVar141 + fVar154 * fVar137 + fVar170 * local_1800._4_4_;
            fVar144 = fStack_1838 * fVar20 + fVar156 * fVar137 + fVar171 * local_1800._4_4_;
            fVar145 = fStack_1838 * fVar21 + fVar158 * fVar137 + fVar172 * local_1800._4_4_;
            fVar146 = fStack_1838 * fVar22 + fVar160 * fVar137 + fVar173 * local_1800._4_4_;
            fVar147 = fStack_1838 * fVar23 + fVar162 * fVar137 + fVar174 * local_1800._4_4_;
            fVar137 = fStack_1838 * fVar24 + fVar164 * fVar137 + fVar116 * local_1800._4_4_;
            fVar148 = fVar25 + fVar25 + 0.0;
            auVar100._0_4_ = fVar96 + fVar96;
            auVar100._4_4_ = fVar143 + fVar143;
            auVar100._8_4_ = fVar144 + fVar144;
            auVar100._12_4_ = fVar145 + fVar145;
            auVar100._16_4_ = fVar146 + fVar146;
            auVar100._20_4_ = fVar147 + fVar147;
            auVar100._24_4_ = fVar137 + fVar137;
            auVar100._28_4_ = fVar148 + fVar148;
            fVar96 = fVar165 * fVar7 + fVar152 * fVar2 + fVar169 * fVar1;
            fVar143 = fVar141 * fVar10 + fVar154 * fVar9 + fVar170 * fVar8;
            fVar106 = fVar20 * fVar108 + fVar156 * fVar107 + fVar171 * fVar106;
            fVar107 = fVar21 * fVar111 + fVar158 * fVar110 + fVar172 * fVar109;
            fVar108 = fVar22 * fVar13 + fVar160 * fVar12 + fVar173 * fVar11;
            fVar109 = fVar23 * fVar16 + fVar162 * fVar15 + fVar174 * fVar14;
            fVar110 = fVar24 * fVar19 + fVar164 * fVar18 + fVar116 * fVar17;
            fVar111 = auVar28._28_4_ + fVar25 + auVar28._28_4_;
            auVar112 = vrcpps_avx(auVar100);
            fVar137 = auVar112._0_4_;
            fVar1 = auVar112._4_4_;
            auVar64._4_4_ = auVar100._4_4_ * fVar1;
            auVar64._0_4_ = auVar100._0_4_ * fVar137;
            fVar2 = auVar112._8_4_;
            auVar64._8_4_ = auVar100._8_4_ * fVar2;
            fVar7 = auVar112._12_4_;
            auVar64._12_4_ = auVar100._12_4_ * fVar7;
            fVar8 = auVar112._16_4_;
            auVar64._16_4_ = auVar100._16_4_ * fVar8;
            fVar9 = auVar112._20_4_;
            auVar64._20_4_ = auVar100._20_4_ * fVar9;
            fVar10 = auVar112._24_4_;
            auVar64._24_4_ = auVar100._24_4_ * fVar10;
            auVar64._28_4_ = auVar98._28_4_;
            auVar136._8_4_ = 0x3f800000;
            auVar136._0_8_ = &DAT_3f8000003f800000;
            auVar136._12_4_ = 0x3f800000;
            auVar136._16_4_ = 0x3f800000;
            auVar136._20_4_ = 0x3f800000;
            auVar136._24_4_ = 0x3f800000;
            auVar136._28_4_ = 0x3f800000;
            auVar98 = vsubps_avx(auVar136,auVar64);
            local_13c0._4_4_ = (fVar143 + fVar143) * (fVar1 + fVar1 * auVar98._4_4_);
            local_13c0._0_4_ = (fVar96 + fVar96) * (fVar137 + fVar137 * auVar98._0_4_);
            local_13c0._8_4_ = (fVar106 + fVar106) * (fVar2 + fVar2 * auVar98._8_4_);
            local_13c0._12_4_ = (fVar107 + fVar107) * (fVar7 + fVar7 * auVar98._12_4_);
            local_13c0._16_4_ = (fVar108 + fVar108) * (fVar8 + fVar8 * auVar98._16_4_);
            local_13c0._20_4_ = (fVar109 + fVar109) * (fVar9 + fVar9 * auVar98._20_4_);
            local_13c0._24_4_ = (fVar110 + fVar110) * (fVar10 + fVar10 * auVar98._24_4_);
            local_13c0._28_4_ = fVar111 + fVar111;
            uVar93 = *(undefined4 *)(local_1840 + k * 4 + 0x60);
            auVar121._4_4_ = uVar93;
            auVar121._0_4_ = uVar93;
            auVar121._8_4_ = uVar93;
            auVar121._12_4_ = uVar93;
            auVar121._16_4_ = uVar93;
            auVar121._20_4_ = uVar93;
            auVar121._24_4_ = uVar93;
            auVar121._28_4_ = uVar93;
            auVar98 = vcmpps_avx(auVar121,local_13c0,2);
            uVar93 = *(undefined4 *)(local_1840 + k * 4 + 0x100);
            auVar131._4_4_ = uVar93;
            auVar131._0_4_ = uVar93;
            auVar131._8_4_ = uVar93;
            auVar131._12_4_ = uVar93;
            auVar131._16_4_ = uVar93;
            auVar131._20_4_ = uVar93;
            auVar131._24_4_ = uVar93;
            auVar131._28_4_ = uVar93;
            auVar112 = vcmpps_avx(local_13c0,auVar131,2);
            auVar98 = vandps_avx(auVar112,auVar98);
            auVar4 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
            auVar97 = vpand_avx(auVar4,auVar97);
            auVar4 = vpmovsxwd_avx(auVar97);
            auVar26 = vpshufd_avx(auVar97,0xee);
            auVar26 = vpmovsxwd_avx(auVar26);
            auVar122._16_16_ = auVar26;
            auVar122._0_16_ = auVar4;
            if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar122 >> 0x7f,0) == '\0') &&
                  (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar26 >> 0x3f,0) == '\0') &&
                (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar26[0xf]) goto LAB_004cb5f9;
            auVar98 = vcmpps_avx(auVar100,_DAT_02020f00,4);
            auVar4 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
            auVar97 = vpand_avx(auVar97,auVar4);
            auVar4 = vpmovsxwd_avx(auVar97);
            auVar26 = vpunpckhwd_avx(auVar97,auVar97);
            local_1420._16_16_ = auVar26;
            local_1420._0_16_ = auVar4;
            if ((((((((local_1420 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1420 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1420 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1420 >> 0x7f,0) == '\0') &&
                  (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar26 >> 0x3f,0) == '\0') &&
                (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar26[0xf]) goto LAB_004cb5f9;
            local_14e0 = local_15a0._0_4_;
            fStack_14dc = local_15a0._4_4_;
            fStack_14d8 = local_15a0._8_4_;
            fStack_14d4 = local_15a0._12_4_;
            fStack_14d0 = local_15a0._16_4_;
            fStack_14cc = local_15a0._20_4_;
            fStack_14c8 = local_15a0._24_4_;
            fStack_14c4 = local_15a0._28_4_;
            local_14c0 = local_15c0._0_4_;
            fStack_14bc = local_15c0._4_4_;
            fStack_14b8 = local_15c0._8_4_;
            fStack_14b4 = local_15c0._12_4_;
            fStack_14b0 = local_15c0._16_4_;
            fStack_14ac = local_15c0._20_4_;
            fStack_14a8 = local_15c0._24_4_;
            fStack_14a4 = local_15c0._28_4_;
            local_14a0 = local_15e0;
            local_1340 = local_1620;
            auVar98 = vrcpps_avx(local_15e0);
            local_1800 = (long)context->scene;
            fVar137 = auVar98._0_4_;
            fVar1 = auVar98._4_4_;
            auVar65._4_4_ = local_15e0._4_4_ * fVar1;
            auVar65._0_4_ = local_15e0._0_4_ * fVar137;
            fVar2 = auVar98._8_4_;
            auVar65._8_4_ = local_15e0._8_4_ * fVar2;
            fVar7 = auVar98._12_4_;
            auVar65._12_4_ = local_15e0._12_4_ * fVar7;
            fVar8 = auVar98._16_4_;
            auVar65._16_4_ = local_15e0._16_4_ * fVar8;
            fVar9 = auVar98._20_4_;
            auVar65._20_4_ = local_15e0._20_4_ * fVar9;
            fVar10 = auVar98._24_4_;
            auVar65._24_4_ = local_15e0._24_4_ * fVar10;
            auVar65._28_4_ = auVar26._12_4_;
            auVar132._8_4_ = 0x3f800000;
            auVar132._0_8_ = &DAT_3f8000003f800000;
            auVar132._12_4_ = 0x3f800000;
            auVar132._16_4_ = 0x3f800000;
            auVar132._20_4_ = 0x3f800000;
            auVar132._24_4_ = 0x3f800000;
            auVar132._28_4_ = 0x3f800000;
            auVar112 = vsubps_avx(auVar132,auVar65);
            auVar104._0_4_ = fVar137 + fVar137 * auVar112._0_4_;
            auVar104._4_4_ = fVar1 + fVar1 * auVar112._4_4_;
            auVar104._8_4_ = fVar2 + fVar2 * auVar112._8_4_;
            auVar104._12_4_ = fVar7 + fVar7 * auVar112._12_4_;
            auVar104._16_4_ = fVar8 + fVar8 * auVar112._16_4_;
            auVar104._20_4_ = fVar9 + fVar9 * auVar112._20_4_;
            auVar104._24_4_ = fVar10 + fVar10 * auVar112._24_4_;
            auVar104._28_4_ = auVar98._28_4_ + auVar112._28_4_;
            auVar114._8_4_ = 0x219392ef;
            auVar114._0_8_ = 0x219392ef219392ef;
            auVar114._12_4_ = 0x219392ef;
            auVar114._16_4_ = 0x219392ef;
            auVar114._20_4_ = 0x219392ef;
            auVar114._24_4_ = 0x219392ef;
            auVar114._28_4_ = 0x219392ef;
            auVar112 = vcmpps_avx(local_1600,auVar114,5);
            auVar98 = vandps_avx(auVar112,auVar104);
            auVar66._4_4_ = local_15a0._4_4_ * auVar98._4_4_;
            auVar66._0_4_ = local_15a0._0_4_ * auVar98._0_4_;
            auVar66._8_4_ = local_15a0._8_4_ * auVar98._8_4_;
            auVar66._12_4_ = local_15a0._12_4_ * auVar98._12_4_;
            auVar66._16_4_ = local_15a0._16_4_ * auVar98._16_4_;
            auVar66._20_4_ = local_15a0._20_4_ * auVar98._20_4_;
            auVar66._24_4_ = local_15a0._24_4_ * auVar98._24_4_;
            auVar66._28_4_ = auVar112._28_4_;
            auVar112 = vminps_avx(auVar66,auVar132);
            auVar67._4_4_ = local_15c0._4_4_ * auVar98._4_4_;
            auVar67._0_4_ = local_15c0._0_4_ * auVar98._0_4_;
            auVar67._8_4_ = local_15c0._8_4_ * auVar98._8_4_;
            auVar67._12_4_ = local_15c0._12_4_ * auVar98._12_4_;
            auVar67._16_4_ = local_15c0._16_4_ * auVar98._16_4_;
            auVar67._20_4_ = local_15c0._20_4_ * auVar98._20_4_;
            auVar67._24_4_ = local_15c0._24_4_ * auVar98._24_4_;
            auVar67._28_4_ = auVar98._28_4_;
            auVar98 = vminps_avx(auVar67,auVar132);
            auVar27 = vsubps_avx(auVar132,auVar112);
            auVar28 = vsubps_avx(auVar132,auVar98);
            local_13e0 = vblendvps_avx(auVar98,auVar27,local_1620);
            local_1400 = vblendvps_avx(auVar112,auVar28,local_1620);
            local_13a0._4_4_ = fVar141 * (float)local_1640._4_4_;
            local_13a0._0_4_ = fVar165 * (float)local_1640._0_4_;
            local_13a0._8_4_ = fVar20 * fStack_1638;
            local_13a0._12_4_ = fVar21 * fStack_1634;
            local_13a0._16_4_ = fVar22 * fStack_1630;
            local_13a0._20_4_ = fVar23 * fStack_162c;
            local_13a0._24_4_ = fVar24 * fStack_1628;
            local_13a0._28_4_ = local_1400._28_4_;
            local_1380._4_4_ = fVar170 * (float)local_1640._4_4_;
            local_1380._0_4_ = fVar169 * (float)local_1640._0_4_;
            local_1380._8_4_ = fVar171 * fStack_1638;
            local_1380._12_4_ = fVar172 * fStack_1634;
            local_1380._16_4_ = fVar173 * fStack_1630;
            local_1380._20_4_ = fVar174 * fStack_162c;
            local_1380._24_4_ = fVar116 * fStack_1628;
            local_1380._28_4_ = auVar112._28_4_;
            local_1360[0] = (float)local_1640._0_4_ * fVar152;
            local_1360[1] = (float)local_1640._4_4_ * fVar154;
            local_1360[2] = fStack_1638 * fVar156;
            local_1360[3] = fStack_1634 * fVar158;
            fStack_1350 = fStack_1630 * fVar160;
            fStack_134c = fStack_162c * fVar162;
            fStack_1348 = fStack_1628 * fVar164;
            uStack_1344 = uStack_1624;
            auVar97 = vpacksswb_avx(auVar97,auVar97);
            uVar92 = (ulong)(byte)(SUB161(auVar97 >> 7,0) & 1 | (SUB161(auVar97 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar97 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar97 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar97 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar97 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar97 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar97 >> 0x3f,0) << 7);
            auVar140 = ZEXT3264(local_16a0);
            auVar151 = ZEXT3264(local_16c0);
            auVar168 = ZEXT3264(local_16e0);
            auVar176 = ZEXT3264(local_1700);
            auVar179 = ZEXT3264(local_1720);
            auVar190 = ZEXT3264(local_1740);
            auVar209 = ZEXT3264(local_1760);
            auVar211 = ZEXT3264(local_1780);
            auVar213 = ZEXT3264(local_17a0);
            auVar123 = ZEXT3264(local_1660);
            auVar133 = ZEXT3264(local_1680);
            fStack_1834 = fStack_1838;
            fStack_1830 = fStack_1838;
            fStack_182c = fStack_1838;
            fStack_1828 = fStack_1838;
            fStack_1824 = fStack_1838;
            do {
              uVar6 = 0;
              if (uVar92 != 0) {
                for (; (uVar92 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                }
              }
              uVar78 = *(uint *)((long)&local_1500 + uVar6 * 4);
              lVar82 = *(long *)(*(long *)(local_1800 + 0x1e8) + (ulong)uVar78 * 8);
              if ((*(uint *)(lVar82 + 0x34) & *(uint *)(local_1840 + k * 4 + 0x120)) == 0) {
                uVar92 = uVar92 ^ 1L << (uVar6 & 0x3f);
                bVar95 = true;
              }
              else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                      (*(long *)(lVar82 + 0x48) == 0)) {
                bVar95 = false;
              }
              else {
                local_1820._0_4_ = *(undefined4 *)(local_1840 + k * 4 + 0x100);
                local_12c0 = *(undefined4 *)(local_1400 + uVar6 * 4);
                uVar93 = *(undefined4 *)(local_13e0 + uVar6 * 4);
                local_12a0._4_4_ = uVar93;
                local_12a0._0_4_ = uVar93;
                local_12a0._8_4_ = uVar93;
                local_12a0._12_4_ = uVar93;
                local_12a0._16_4_ = uVar93;
                local_12a0._20_4_ = uVar93;
                local_12a0._24_4_ = uVar93;
                local_12a0._28_4_ = uVar93;
                *(undefined4 *)(local_1840 + k * 4 + 0x100) =
                     *(undefined4 *)(local_13c0 + uVar6 * 4);
                local_17d0.context = context->user;
                local_1280 = *(undefined4 *)((long)&local_1520 + uVar6 * 4);
                local_1320 = *(undefined4 *)(local_13a0 + uVar6 * 4);
                fVar137 = local_1360[uVar6 - 8];
                local_1300._4_4_ = fVar137;
                local_1300._0_4_ = fVar137;
                local_1300._8_4_ = fVar137;
                local_1300._12_4_ = fVar137;
                local_1300._16_4_ = fVar137;
                local_1300._20_4_ = fVar137;
                local_1300._24_4_ = fVar137;
                local_1300._28_4_ = fVar137;
                local_1250 = vpshufd_avx(ZEXT416(uVar78),0);
                fVar137 = local_1360[uVar6];
                local_12e0._4_4_ = fVar137;
                local_12e0._0_4_ = fVar137;
                local_12e0._8_4_ = fVar137;
                local_12e0._12_4_ = fVar137;
                local_12e0._16_4_ = fVar137;
                local_12e0._20_4_ = fVar137;
                local_12e0._24_4_ = fVar137;
                local_12e0._28_4_ = fVar137;
                uStack_131c = local_1320;
                uStack_1318 = local_1320;
                uStack_1314 = local_1320;
                uStack_1310 = local_1320;
                uStack_130c = local_1320;
                uStack_1308 = local_1320;
                uStack_1304 = local_1320;
                uStack_12bc = local_12c0;
                uStack_12b8 = local_12c0;
                uStack_12b4 = local_12c0;
                uStack_12b0 = local_12c0;
                uStack_12ac = local_12c0;
                uStack_12a8 = local_12c0;
                uStack_12a4 = local_12c0;
                uStack_127c = local_1280;
                uStack_1278 = local_1280;
                uStack_1274 = local_1280;
                uStack_1270 = local_1280;
                uStack_126c = local_1280;
                uStack_1268 = local_1280;
                uStack_1264 = local_1280;
                local_1260 = local_1250;
                auVar98 = vcmpps_avx(local_12a0,local_12a0,0xf);
                uStack_123c = (local_17d0.context)->instID[0];
                local_1240 = uStack_123c;
                uStack_1238 = uStack_123c;
                uStack_1234 = uStack_123c;
                uStack_1230 = uStack_123c;
                uStack_122c = uStack_123c;
                uStack_1228 = uStack_123c;
                uStack_1224 = uStack_123c;
                uStack_121c = (local_17d0.context)->instPrimID[0];
                local_1220 = uStack_121c;
                uStack_1218 = uStack_121c;
                uStack_1214 = uStack_121c;
                uStack_1210 = uStack_121c;
                uStack_120c = uStack_121c;
                uStack_1208 = uStack_121c;
                uStack_1204 = uStack_121c;
                local_1900 = *(undefined8 *)(mm_lookupmask_ps + uVar83);
                uStack_18f8 = *(undefined8 *)(mm_lookupmask_ps + uVar83 + 8);
                local_18f0 = *(undefined8 *)(mm_lookupmask_ps + lVar81);
                uStack_18e8 = *(undefined8 *)(mm_lookupmask_ps + lVar81 + 8);
                local_17d0.valid = (int *)&local_1900;
                local_17d0.geometryUserPtr = *(void **)(lVar82 + 0x18);
                local_17d0.hit = (RTCHitN *)&local_1320;
                local_17d0.N = 8;
                local_17d0.ray = (RTCRayN *)local_1840;
                if (*(code **)(lVar82 + 0x48) != (code *)0x0) {
                  local_1860._0_8_ = k;
                  local_18c0._0_8_ = uVar85;
                  local_1880._0_8_ = puVar87;
                  local_18a0._0_8_ = uVar88;
                  local_18e0._0_8_ = uVar89;
                  auVar98 = ZEXT1632(auVar98._0_16_);
                  (**(code **)(lVar82 + 0x48))(&local_17d0);
                  auVar98 = vcmpps_avx(auVar98,auVar98,0xf);
                  auVar213 = ZEXT3264(local_17a0);
                  auVar211 = ZEXT3264(local_1780);
                  auVar209 = ZEXT3264(local_1760);
                  auVar190 = ZEXT3264(local_1740);
                  auVar179 = ZEXT3264(local_1720);
                  auVar176 = ZEXT3264(local_1700);
                  auVar168 = ZEXT3264(local_16e0);
                  auVar151 = ZEXT3264(local_16c0);
                  auVar140 = ZEXT3264(local_16a0);
                  k = local_1860._0_8_;
                  uVar89 = local_18e0._0_8_;
                  uVar85 = local_18c0._0_8_;
                  puVar87 = (ulong *)local_1880._0_8_;
                  uVar88 = local_18a0._0_8_;
                }
                auVar97._8_8_ = uStack_18f8;
                auVar97._0_8_ = local_1900;
                auVar97 = vpcmpeqd_avx((undefined1  [16])0x0,auVar97);
                auVar4._8_8_ = uStack_18e8;
                auVar4._0_8_ = local_18f0;
                auVar4 = vpcmpeqd_avx((undefined1  [16])0x0,auVar4);
                auVar101._16_16_ = auVar4;
                auVar101._0_16_ = auVar97;
                auVar98 = auVar98 & ~auVar101;
                auVar112 = vcmpps_avx(ZEXT1632(auVar4),ZEXT1632(auVar4),0xf);
                auVar123 = ZEXT3264(local_1660);
                auVar133 = ZEXT3264(local_1680);
                if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar98 >> 0x7f,0) == '\0') &&
                      (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar98 >> 0xbf,0) == '\0') &&
                    (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar98[0x1f]) {
                  auVar102._0_4_ = auVar97._0_4_ ^ auVar112._0_4_;
                  auVar102._4_4_ = auVar97._4_4_ ^ auVar112._4_4_;
                  auVar102._8_4_ = auVar97._8_4_ ^ auVar112._8_4_;
                  auVar102._12_4_ = auVar97._12_4_ ^ auVar112._12_4_;
                  auVar102._16_4_ = auVar4._0_4_ ^ auVar112._16_4_;
                  auVar102._20_4_ = auVar4._4_4_ ^ auVar112._20_4_;
                  auVar102._24_4_ = auVar4._8_4_ ^ auVar112._24_4_;
                  auVar102._28_4_ = auVar4._12_4_ ^ auVar112._28_4_;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar82 + 0x3e) & 0x40) != 0))))
                  {
                    local_1860._0_8_ = k;
                    local_18c0._0_8_ = uVar85;
                    local_1880._0_8_ = puVar87;
                    local_18a0._0_8_ = uVar88;
                    local_18e0._0_8_ = uVar89;
                    (*p_Var5)(&local_17d0);
                    auVar133 = ZEXT3264(local_1680);
                    auVar123 = ZEXT3264(local_1660);
                    auVar213 = ZEXT3264(local_17a0);
                    auVar211 = ZEXT3264(local_1780);
                    auVar209 = ZEXT3264(local_1760);
                    auVar190 = ZEXT3264(local_1740);
                    auVar179 = ZEXT3264(local_1720);
                    auVar176 = ZEXT3264(local_1700);
                    auVar168 = ZEXT3264(local_16e0);
                    auVar151 = ZEXT3264(local_16c0);
                    auVar140 = ZEXT3264(local_16a0);
                    k = local_1860._0_8_;
                    uVar89 = local_18e0._0_8_;
                    uVar85 = local_18c0._0_8_;
                    puVar87 = (ulong *)local_1880._0_8_;
                    uVar88 = local_18a0._0_8_;
                  }
                  auVar26._8_8_ = uStack_18f8;
                  auVar26._0_8_ = local_1900;
                  auVar97 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar26);
                  auVar76._8_8_ = uStack_18e8;
                  auVar76._0_8_ = local_18f0;
                  auVar4 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar76);
                  auVar105._16_16_ = auVar4;
                  auVar105._0_16_ = auVar97;
                  auVar102._0_8_ = auVar97._0_8_ ^ 0xffffffffffffffff;
                  auVar102._8_4_ = auVar97._8_4_ ^ 0xffffffff;
                  auVar102._12_4_ = auVar97._12_4_ ^ 0xffffffff;
                  auVar102._16_4_ = auVar4._0_4_ ^ 0xffffffff;
                  auVar102._20_4_ = auVar4._4_4_ ^ 0xffffffff;
                  auVar102._24_4_ = auVar4._8_4_ ^ 0xffffffff;
                  auVar102._28_4_ = auVar4._12_4_ ^ 0xffffffff;
                  auVar115._8_4_ = 0xff800000;
                  auVar115._0_8_ = 0xff800000ff800000;
                  auVar115._12_4_ = 0xff800000;
                  auVar115._16_4_ = 0xff800000;
                  auVar115._20_4_ = 0xff800000;
                  auVar115._24_4_ = 0xff800000;
                  auVar115._28_4_ = 0xff800000;
                  auVar98 = vblendvps_avx(auVar115,*(undefined1 (*) [32])(local_17d0.ray + 0x100),
                                          auVar105);
                  *(undefined1 (*) [32])(local_17d0.ray + 0x100) = auVar98;
                }
                bVar74 = (auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                bVar75 = (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                bVar73 = (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                bVar72 = SUB321(auVar102 >> 0x7f,0) == '\0';
                bVar71 = (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                bVar70 = SUB321(auVar102 >> 0xbf,0) == '\0';
                bVar69 = (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                bVar68 = -1 < auVar102[0x1f];
                bVar95 = ((((((bVar74 && bVar75) && bVar73) && bVar72) && bVar71) && bVar70) &&
                         bVar69) && bVar68;
                if (((((((bVar74 && bVar75) && bVar73) && bVar72) && bVar71) && bVar70) && bVar69)
                    && bVar68) {
                  *(undefined4 *)(local_1840 + k * 4 + 0x100) = local_1820._0_4_;
                  uVar92 = uVar92 ^ 1L << (uVar6 & 0x3f);
                }
              }
            } while ((bVar95) && (uVar92 != 0));
            if (!bVar95) break;
          }
          uVar84 = uVar84 + 1;
          bVar94 = uVar84 < uVar89;
        } while (uVar84 != uVar89);
      }
      uVar78 = 0;
      if (bVar94) {
        *(undefined4 *)(local_1840 + k * 4 + 0x100) = 0xff800000;
        uVar78 = 1;
      }
    }
  } while ((uVar78 & 3) == 0);
  return puVar86 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }